

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

int Gia_ManBalanceGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper,int *pLits,int nLits)

{
  uint uVar1;
  int Entry;
  int iVar2;
  int iVar3;
  Bal_Man_t *p_00;
  int kBest;
  int iBest;
  int Res;
  int iLit;
  int i;
  Bal_Man_t *p;
  int nLits_local;
  int *pLits_local;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *pNew_local;
  
  Vec_IntClear(vSuper);
  if (nLits == 1) {
    Vec_IntPush(vSuper,*pLits);
  }
  else if (nLits == 2) {
    Vec_IntPush(vSuper,*pLits);
    Vec_IntPush(vSuper,pLits[1]);
    Gia_ManCreateGate(pNew,pObj,vSuper);
  }
  else if (2 < nLits) {
    p_00 = Bal_GiaMan(pNew);
    for (Res = 0; Res < nLits; Res = Res + 1) {
      Vec_IntPush(vSuper,pLits[Res]);
    }
    Vec_IntSelectSortCostLit(vSuper,p_00->vCosts);
    while (iVar3 = Vec_IntSize(vSuper), 1 < iVar3) {
      uVar1 = Bal_ManFindBestPair(p_00,vSuper,pObj);
      iVar3 = Vec_IntEntry(vSuper,(int)uVar1 >> 0x10);
      Entry = Vec_IntEntry(vSuper,uVar1 & 0xffff);
      Vec_IntRemove(vSuper,iVar3);
      Vec_IntRemove(vSuper,Entry);
      iVar2 = Gia_ObjIsXor(pObj);
      if (iVar2 == 0) {
        iBest = Gia_ManHashAnd(pNew,iVar3,Entry);
      }
      else {
        iBest = Gia_ManHashXorReal(pNew,iVar3,Entry);
      }
      Bal_ManSetGateLevel(p_00,pObj,iBest);
      Vec_IntPushOrderCost2(vSuper,p_00->vCosts,iBest);
    }
  }
  iVar3 = Vec_IntSize(vSuper);
  if (iVar3 != 1) {
    __assert_fail("Vec_IntSize(vSuper) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalLut.c"
                  ,0x35c,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)"
                 );
  }
  iVar3 = Vec_IntEntry(vSuper,0);
  return iVar3;
}

Assistant:

int Gia_ManBalanceGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper, int * pLits, int nLits )
{
    assert( !Gia_ObjIsBuf(pObj) );
    Vec_IntClear( vSuper );
    if ( nLits == 1 )
        Vec_IntPush( vSuper, pLits[0] );
    else if ( nLits == 2 )
    {
        Vec_IntPush( vSuper, pLits[0] );
        Vec_IntPush( vSuper, pLits[1] );
        Gia_ManCreateGate( pNew, pObj, vSuper );
    }
    else if ( nLits > 2 )
    {
        // collect levels
        int i, * pArray, * pPerm; //int iLit;
        for ( i = 0; i < nLits; i++ )
            Vec_IntPush( vSuper, Gia_ObjLevelId(pNew, Abc_Lit2Var(pLits[i])) );
        // sort by level
        Vec_IntGrow( vSuper, 4 * nLits );        
        pArray = Vec_IntArray( vSuper );
        pPerm = pArray + nLits;
        Abc_QuickSortCostData( pArray, nLits, 1, (word *)(pArray + 2 * nLits), pPerm );
        // collect in the increasing order of level
        for ( i = 0; i < nLits; i++ )
            Vec_IntWriteEntry( vSuper, i, pLits[pPerm[i]] );
        Vec_IntShrink( vSuper, nLits );
/*            
        Vec_IntForEachEntry( vSuper, iLit, i )
            printf( "%d ", Gia_ObjLevel(pNew, Gia_ManObj( pNew, Abc_Lit2Var(iLit) )) );
        printf( "\n" );
*/
        // perform incremental extraction
        while ( Vec_IntSize(vSuper) > 1 )
        {
            if ( !Gia_ObjIsXor(pObj) )
                Gia_ManPrepareLastTwo( pNew, vSuper );
            Gia_ManCreateGate( pNew, pObj, vSuper );
        }
    }
    // consider trivial case
    assert( Vec_IntSize(vSuper) == 1 );
    return Vec_IntEntry(vSuper, 0);
}